

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_9bc04a::HandleExportMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer puVar2;
  cmTargetExport *pcVar3;
  cmMakefile *this;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  string *psVar7;
  long lVar8;
  cmGlobalGenerator *pcVar9;
  cmTarget *this_00;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  cmExportSet *pcVar10;
  pointer puVar11;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  bool exportOld;
  undefined1 local_3fa [2];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [40];
  string fname;
  MessageLevel message;
  cmExportSet *local_390;
  string exp;
  string name_space;
  undefined1 local_348 [32];
  size_type local_328;
  pointer local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308 [32];
  string filename;
  Helper helper;
  string cxx_modules_directory;
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string local_238;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,helper.DefaultComponentName._M_dataplus._M_p,
             helper.DefaultComponentName._M_dataplus._M_p +
             helper.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  name_space._M_string_length = 0;
  name_space.field_2._M_local_buf[0] = '\0';
  exportOld = false;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  cxx_modules_directory._M_string_length = 0;
  cxx_modules_directory.field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "EXPORT";
  name.super_string_view._M_len = 6;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  cxx_modules_directory._M_dataplus._M_p = (pointer)&cxx_modules_directory.field_2;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name,&exp);
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_00,&name_space);
  name_01.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_01.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_01,&exportOld);
  name_02.super_string_view._M_str = "FILE";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_02,&filename);
  bVar4 = cmExperimental::HasSupportEnabled(helper.Makefile,CxxModuleCMakeApi);
  if (bVar4) {
    name_03.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
    name_03.super_string_view._M_len = 0x15;
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              (&ica.super_cmArgumentParser<void>,name_03,&cxx_modules_directory);
  }
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar4) {
      psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar7->_M_string_length == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_348._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_348._0_8_ = pbVar1->_M_string_length;
        local_348._16_8_ = 0x16;
        local_348._24_8_ = " given no DESTINATION!";
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_348;
        cmCatViews_abi_cxx11_((string *)local_3f8,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00290bc3;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename._M_dataplus._M_p,
                 filename._M_dataplus._M_p + filename._M_string_length);
      lVar8 = std::__cxx11::string::find_first_of((char *)&fname,0x7b401b,0);
      if (lVar8 == -1) {
        if (fname._M_string_length == 0) {
          bVar4 = false;
        }
        else {
          cmsys::SystemTools::GetFilenameLastExtension(&local_238,&fname);
          iVar5 = std::__cxx11::string::compare((char *)&local_238);
          bVar4 = iVar5 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar4) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_348._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_348._0_8_ = pbVar1->_M_string_length;
          local_348._16_8_ = 0x21;
          local_348._24_8_ = " given invalid export file name \"";
          local_328 = fname._M_string_length;
          local_320 = fname._M_dataplus._M_p;
          local_318 = 0x3d;
          local_310 = "\".  The FILE argument must specify a name ending in \".cmake\".";
          views_02._M_len = 4;
          views_02._M_array = (iterator)local_348;
          cmCatViews_abi_cxx11_((string *)local_3f8,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00290ed6;
        }
        if (fname._M_string_length == 0) {
          local_348._0_8_ = exp._M_string_length;
          local_348._8_8_ = exp._M_dataplus._M_p;
          local_348._16_8_ = 6;
          local_348._24_8_ = ".cmake";
          views_04._M_len = 2;
          views_04._M_array = (iterator)local_348;
          cmCatViews_abi_cxx11_((string *)local_3f8,views_04);
          std::__cxx11::string::operator=((string *)&fname,(string *)local_3f8);
          if ((cmExportSet *)local_3f8._0_8_ != (cmExportSet *)local_3e8) {
            operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
          }
          lVar8 = std::__cxx11::string::find_first_of((char *)&fname,0x7b401b,0);
          if (lVar8 == -1) goto LAB_00290f24;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_348._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_348._0_8_ = pbVar1->_M_string_length;
          local_3f8._0_8_ = &DAT_00000014;
          local_3f8._8_8_ = " given export name \"";
          cmStrCat<std::__cxx11::string,char[144]>
                    ((string *)local_308,(cmAlphaNum *)local_348,(cmAlphaNum *)local_3f8,&exp,
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          pcVar10 = (cmExportSet *)local_308._0_8_;
          if ((cmExportSet *)local_308._0_8_ != (cmExportSet *)(local_308 + 0x10))
          goto LAB_00290ee9;
          goto LAB_00290ef1;
        }
LAB_00290f24:
        pcVar9 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        local_390 = cmExportSetMap::operator[](&pcVar9->ExportSets,&exp);
        if (exportOld == true) {
          puVar11 = (local_390->TargetExports).
                    super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (local_390->TargetExports).
                   super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (puVar11 != puVar2) {
            do {
              pcVar9 = cmMakefile::GetGlobalGenerator(helper.Makefile);
              this_00 = cmGlobalGenerator::FindTarget
                                  (pcVar9,&((puVar11->_M_t).
                                            super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                            .super__Head_base<0UL,_cmTargetExport_*,_false>.
                                           _M_head_impl)->TargetName,false);
              if ((this_00 == (cmTarget *)0x0) ||
                 (PVar6 = cmTarget::GetPolicyStatus(this_00,CMP0022), PVar6 == WARN)) {
                bVar4 = false;
              }
              else {
                PVar6 = cmTarget::GetPolicyStatus(this_00,CMP0022);
                bVar4 = PVar6 != OLD;
              }
              if (!bVar4) {
                pcVar3 = (puVar11->_M_t).
                         super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                         .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
                local_348._24_8_ = (pcVar3->TargetName)._M_dataplus;
                local_348._16_8_ = (pcVar3->TargetName)._M_string_length;
                local_348._0_8_ = 0x4d;
                local_348._8_8_ =
                     "INSTALL(EXPORT) given keyword \"EXPORT_LINK_INTERFACE_LIBRARIES\", but target \""
                ;
                local_328 = 0x2a;
                local_320 = "\" does not have policy CMP0022 set to NEW.";
                views_03._M_len = 3;
                views_03._M_array = (iterator)local_348;
                cmCatViews_abi_cxx11_((string *)local_3f8,views_03);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                if ((cmExportSet *)local_3f8._0_8_ != (cmExportSet *)local_3e8) {
                  operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
                }
                goto LAB_00290ef1;
              }
              puVar11 = puVar11 + 1;
            } while (puVar11 != puVar2);
          }
        }
        message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,false);
        this = helper.Makefile;
        local_308._0_8_ = local_390;
        psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        local_3fa[1] = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        local_3fa[0] = 0;
        cmMakefile::GetBacktrace(helper.Makefile);
        std::
        make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,bool&,bool,cmListFileBacktrace>
                  ((cmExportSet **)local_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   psVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__args_3,__args_4,(MessageLevel *)__args_5,(bool *)&message,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_3fa + 1),&fname,&name_space,(bool *)&cxx_modules_directory,&exportOld,
                   (cmListFileBacktrace *)local_3fa);
        local_3e8._32_8_ = local_3f8._0_8_;
        local_3f8._0_8_ = (long *)0x0;
        cmMakefile::AddInstallGenerator
                  (this,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        (local_3e8 + 0x20));
        if ((cmExportSet *)local_3e8._32_8_ != (cmExportSet *)0x0) {
          (*(code *)(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                       *)local_3e8._32_8_)->
                    super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>)();
        }
        local_3e8._32_8_ = 0;
        if ((long *)local_3f8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_3f8._0_8_ + 8))();
        }
        local_3f8._0_8_ = (cmExportSet *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
        }
        bVar4 = true;
      }
      else {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_348._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_348._0_8_ = pbVar1->_M_string_length;
        local_348._16_8_ = 0x21;
        local_348._24_8_ = " given invalid export file name \"";
        local_328 = fname._M_string_length;
        local_320 = fname._M_dataplus._M_p;
        local_318 = 0x5c;
        local_310 = 
        "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
        ;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_348;
        cmCatViews_abi_cxx11_((string *)local_3f8,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00290ed6:
        local_308._16_8_ = local_3e8._0_8_;
        pcVar10 = (cmExportSet *)local_3f8._0_8_;
        if ((cmExportSet *)local_3f8._0_8_ != (cmExportSet *)local_3e8) {
LAB_00290ee9:
          operator_delete(pcVar10,local_308._16_8_ + 1);
        }
LAB_00290ef1:
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00290cd5;
    }
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_348._8_8_ = (pbVar1->_M_dataplus)._M_p;
    local_348._0_8_ = pbVar1->_M_string_length;
    local_348._16_8_ = 0x19;
    local_348._24_8_ = " given unknown argument \"";
    local_320 = ((unknownArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_328 = (unknownArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_318 = 2;
    local_310 = "\".";
    views._M_len = 4;
    views._M_array = (iterator)local_348;
    cmCatViews_abi_cxx11_((string *)local_3f8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00290bc3:
    if ((cmExportSet *)local_3f8._0_8_ != (cmExportSet *)local_3e8) {
      operator_delete((void *)local_3f8._0_8_,local_3e8._0_8_ + 1);
    }
  }
  bVar4 = false;
LAB_00290cd5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cxx_modules_directory._M_dataplus._M_p != &cxx_modules_directory.field_2) {
    operator_delete(cxx_modules_directory._M_dataplus._M_p,
                    CONCAT71(cxx_modules_directory.field_2._M_allocated_capacity._1_7_,
                             cxx_modules_directory.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                             filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space._M_dataplus._M_p != &name_space.field_2) {
    operator_delete(name_space._M_dataplus._M_p,
                    CONCAT71(name_space.field_2._M_allocated_capacity._1_7_,
                             name_space.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p,
                    CONCAT71(exp.field_2._M_allocated_capacity._1_7_,exp.field_2._M_local_buf[0]) +
                    1);
  }
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helper.DefaultComponentName._M_dataplus._M_p != &helper.DefaultComponentName.field_2) {
    operator_delete(helper.DefaultComponentName._M_dataplus._M_p,
                    helper.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleExportMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;
  std::string cxx_modules_directory;

  ica.Bind("EXPORT"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    *helper.Makefile, cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    ica.Bind("CXX_MODULES_DIRECTORY"_s, cxx_modules_directory);
  }

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  "
                             "The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    status.SetError(
      cmStrCat(args[0], " given invalid export file name \"", fname,
               "\".  "
               "The FILE argument must specify a name ending in \".cmake\"."));
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = cmStrCat(exp, ".cmake");

    if (fname.find_first_of(":/\\") != std::string::npos) {
      status.SetError(cmStrCat(
        args[0], " given export name \"", exp,
        "\".  "
        "This name cannot be safely converted to a file name.  "
        "Specify a different export name or use the FILE option to set "
        "a file name explicitly."));
      return false;
    }
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];
  if (exportOld) {
    for (auto const& te : exportSet.GetTargetExports()) {
      cmTarget* tgt =
        helper.Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        status.SetError(cmStrCat(
          "INSTALL(EXPORT) given keyword \""
          "EXPORT_LINK_INTERFACE_LIBRARIES\", but target \"",
          te->TargetName, "\" does not have policy CMP0022 set to NEW."));
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, cxx_modules_directory,
      exportOld, false, helper.Makefile->GetBacktrace()));

  return true;
}